

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
PeleLM::compute_differential_diffusion_terms
          (PeleLM *this,MultiFab *D,MultiFab *DD,Real time,Real dt,bool include_Wbar_terms)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  MultiFab **ppMVar4;
  BCRec *pBVar5;
  byte in_CL;
  FabArrayBase *in_RDX;
  FabArrayBase *in_RSI;
  long in_RDI;
  int nc;
  BCRec *d_bcrec_rhoh;
  BCRec *d_bcrec_temp;
  BCRec *d_bcrec_spec;
  MultiFab **beta;
  FluxBoxes fb_diff;
  PeleLM *crselev;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> scalarsCrse;
  MultiFab *scalars;
  FillPatchIterator S_fpi;
  int nComp;
  int eComp;
  int sComp;
  int nGrowDiff;
  MultiFab **flux;
  TimeLevel whichTime;
  Real in_stack_000006d0;
  Real in_stack_000006d8;
  MultiFab **in_stack_000006e0;
  int in_stack_000006ec;
  MultiFab *in_stack_000006f0;
  int in_stack_000006fc;
  MultiFab *in_stack_00000700;
  PeleLM *in_stack_00000708;
  int in_stack_00000970;
  int in_stack_00000978;
  BCRec *in_stack_00000980;
  int in_stack_00000988;
  undefined1 in_stack_0000112f;
  Real in_stack_00001130;
  Real in_stack_00001138;
  MultiFab **in_stack_00001140;
  MultiFab **in_stack_00001148;
  MultiFab *in_stack_00001150;
  MultiFab *in_stack_00001158;
  PeleLM *in_stack_00001160;
  char *in_stack_fffffffffffffbe8;
  value_type val;
  PeleLM *__p;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffbf4;
  undefined1 cross;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffc04;
  int in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  AmrLevel *in_stack_fffffffffffffc28;
  FillPatchIterator *in_stack_fffffffffffffc30;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffffc40;
  Real in_stack_fffffffffffffc58;
  undefined1 *in_stack_fffffffffffffc60;
  PeleLM *in_stack_fffffffffffffc68;
  type in_stack_fffffffffffffc70;
  PeleLM *in_stack_fffffffffffffc78;
  BoxArray *in_stack_fffffffffffffc80;
  undefined8 local_350;
  FluxBoxes local_2e0;
  undefined1 local_2d1;
  undefined1 local_2d0 [236];
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined8 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe34;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe50;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Geometry *in_stack_ffffffffffffff78;
  MultiFab *in_stack_ffffffffffffff80;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  undefined4 local_44;
  undefined8 local_40;
  TimeLevel local_38;
  byte local_31;
  FabArrayBase *local_20;
  FabArrayBase *local_18;
  char *local_8;
  
  local_31 = in_CL & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (hack_nospecdiff != 0) {
    local_8 = "compute_differential_diffusion_terms: hack_nospecdiff not implemented";
    amrex::Error_host((char *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  }
  local_38 = amrex::AmrLevel::which_time
                       ((AmrLevel *)in_stack_fffffffffffffc68,
                        (int)((ulong)in_stack_fffffffffffffc60 >> 0x20),in_stack_fffffffffffffc58);
  if (local_38 == AmrOldTime) {
    local_350 = *(undefined8 *)(in_RDI + 0x18f0);
  }
  else {
    local_350 = *(undefined8 *)(in_RDI + 0x18f8);
  }
  local_40 = local_350;
  local_44 = 1;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                          in_stack_fffffffffffffbe8);
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                            in_stack_fffffffffffffbe8);
    uVar6 = (undefined4)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
    if (!bVar1) {
      local_44 = 2;
      goto LAB_002b20bd;
    }
  }
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  local_44 = 3;
LAB_002b20bd:
  local_4c = 3;
  local_50 = first_spec;
  local_54 = NavierStokesBase::Temp;
  piVar3 = std::min<int>(&stack0xffffffffffffffb0,&stack0xffffffffffffffac);
  piVar3 = std::min<int>(&stack0xffffffffffffffb4,piVar3);
  local_48 = *piVar3;
  local_5c = 3;
  local_60 = last_spec;
  local_64 = NavierStokesBase::Temp;
  piVar3 = std::max<int>(&stack0xffffffffffffffa0,&stack0xffffffffffffff9c);
  piVar3 = std::max<int>(&stack0xffffffffffffffa4,piVar3);
  local_58 = *piVar3;
  val = (value_type)CONCAT44(uVar6,(local_58 - local_48) + 1);
  amrex::FillPatchIterator::FillPatchIterator
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (MultiFab *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),(Real)in_stack_fffffffffffffc10,
             in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08,(int)in_stack_fffffffffffffc40);
  local_2d0._80_8_ = amrex::FillPatchIterator::get_mf((FillPatchIterator *)(local_2d0 + 0x58));
  std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
  unique_ptr<std::default_delete<amrex::MultiFab>,void>
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  if (0 < *(int *)(in_RDI + 8)) {
    local_2d0._64_8_ =
         getLevel((PeleLM *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                  (int)((ulong)val >> 0x20));
    operator_new(0x180);
    local_2d1 = 1;
    in_stack_fffffffffffffc80 = amrex::AmrLevel::boxArray((AmrLevel *)local_2d0._64_8_);
    amrex::AmrLevel::DistributionMap((AmrLevel *)local_2d0._64_8_);
    local_2d0._24_8_ = 0.0;
    local_2d0._32_8_ = 0.0;
    local_2d0._8_8_ = 0;
    local_2d0._16_8_ = 0;
    local_2d0._40_8_ = 0.0;
    amrex::MFInfo::MFInfo((MFInfo *)0x2b22ab);
    local_2d0._0_8_ = (_func_int **)0x0;
    __p = (PeleLM *)local_2d0;
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    in_stack_fffffffffffffc78 = __p;
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_fffffffffffffc30,(BoxArray *)in_stack_fffffffffffffc28,
               (DistributionMapping *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),(int)in_stack_fffffffffffffc18,
               (MFInfo *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc40);
    local_2d1 = 0;
    in_stack_fffffffffffffc60 = local_2d0 + 0x48;
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),(pointer)__p);
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x2b233d);
    amrex::MFInfo::~MFInfo((MFInfo *)0x2b234a);
    in_stack_fffffffffffffc68 = (PeleLM *)local_2d0._64_8_;
    in_stack_fffffffffffffc70 =
         std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                   ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                    CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    val = (value_type)((ulong)__p & 0xffffffff00000000);
    amrex::AmrLevel::FillPatch
              ((AmrLevel *)in_stack_fffffffffffffe40,(MultiFab *)in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe34,(Real)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
               in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe50);
  }
  FluxBoxes::FluxBoxes(&local_2e0);
  ppMVar4 = FluxBoxes::define((FluxBoxes *)in_stack_fffffffffffffc80,
                              (AmrLevel *)in_stack_fffffffffffffc78,
                              (int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                              (int)in_stack_fffffffffffffc70);
  iVar2 = (int)((ulong)ppMVar4 >> 0x20);
  getDiffusivity(in_stack_fffffffffffffc78,(MultiFab **)in_stack_fffffffffffffc70,
                 (Real)in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                 (int)in_stack_fffffffffffffc60,iVar2);
  getDiffusivity(in_stack_fffffffffffffc78,(MultiFab **)in_stack_fffffffffffffc70,
                 (Real)in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                 (int)in_stack_fffffffffffffc60,iVar2);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  compute_differential_diffusion_fluxes
            (in_stack_00001160,in_stack_00001158,in_stack_00001150,in_stack_00001148,
             in_stack_00001140,in_stack_00001138,in_stack_00001130,(bool)in_stack_0000112f);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)
             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),val);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)
             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),val);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(in_RDI + 0xbe0));
  flux_divergenceRD(in_stack_00000708,in_stack_00000700,in_stack_000006fc,in_stack_000006f0,
                    in_stack_000006ec,in_stack_000006e0,in_stack_00000970,in_stack_00000978,
                    in_stack_00000980,in_stack_000006d8,in_stack_000006d0,in_stack_00000988);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(in_RDI + 0xbe0));
  flux_divergenceRD(in_stack_00000708,in_stack_00000700,in_stack_000006fc,in_stack_000006f0,
                    in_stack_000006ec,in_stack_000006e0,in_stack_00000970,in_stack_00000978,
                    in_stack_00000980,in_stack_000006d8,in_stack_000006d0,in_stack_00000988);
  pBVar5 = amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                     ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(in_RDI + 0xbe0));
  cross = (undefined1)((ulong)(pBVar5 + (RhoH + -3)) >> 0x38);
  uVar7 = 0;
  uVar6 = 1;
  flux_divergenceRD(in_stack_00000708,in_stack_00000700,in_stack_000006fc,in_stack_000006f0,
                    in_stack_000006ec,in_stack_000006e0,in_stack_00000970,in_stack_00000978,
                    in_stack_00000980,in_stack_000006d8,in_stack_000006d0,in_stack_00000988);
  iVar2 = amrex::FabArrayBase::nGrow(local_18,0);
  if (0 < iVar2) {
    iVar2 = amrex::FabArrayBase::nGrow(local_20,0);
    if (0 < iVar2) {
      amrex::Geometry::periodicity
                ((Geometry *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08,
                 (Periodicity *)CONCAT44(in_stack_fffffffffffffc04,uVar7),(bool)cross);
      amrex::Geometry::periodicity
                ((Geometry *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08,
                 (Periodicity *)CONCAT44(in_stack_fffffffffffffc04,uVar7),(bool)cross);
      amrex::FabArrayBase::nGrow(local_18,0);
      amrex::Extrapolater::FirstOrderExtrap
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      amrex::FabArrayBase::nGrow(local_20,0);
      amrex::Extrapolater::FirstOrderExtrap
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
  }
  FluxBoxes::~FluxBoxes((FluxBoxes *)0x2b28d4);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             CONCAT44(in_stack_fffffffffffffbf4,uVar6));
  amrex::FillPatchIterator::~FillPatchIterator
            ((FillPatchIterator *)CONCAT44(in_stack_fffffffffffffbf4,uVar6));
  return;
}

Assistant:

void
PeleLM::compute_differential_diffusion_terms (MultiFab& D,
                                              MultiFab& DD,
                                              Real      time,
                                              Real      dt,
                                              bool      include_Wbar_terms)
{
   BL_PROFILE("PLM::compute_differential_diffusion_terms()");
   //
   // Sets vt for species, RhoH and Temp together
   // Uses state at time to explicitly compute fluxes, and resets internal
   //  data for fluxes, etc
   //
   AMREX_ASSERT(D.boxArray() == grids);
   AMREX_ASSERT(D.nComp() >= NUM_SPECIES+2); // room for spec+RhoH+Temp

   if (hack_nospecdiff)
   {
     amrex::Error("compute_differential_diffusion_terms: hack_nospecdiff not implemented");
   }

   const TimeLevel whichTime = which_time(State_Type,time);
   AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);
   MultiFab* const * flux = (whichTime == AmrOldTime) ? SpecDiffusionFluxn : SpecDiffusionFluxnp1;

   // Get scalars with proper ghost cells. Might need more than what's available in the class
   // data, so use an FPI.
   int nGrowDiff = 1;
#ifdef AMREX_USE_EB
   if ( diffusion_redistribution_type == "StateRedist" ||
        diffusion_redistribution_type == "NewStateRedist" ) {
       nGrowDiff = 3;
   } else {
       nGrowDiff = 2;
   }
#endif

   int sComp = std::min((int)Density, std::min((int)first_spec,(int)Temp) );
   int eComp = std::max((int)Density, std::max((int)last_spec,(int)Temp) );
   int nComp = eComp - sComp + 1;
   FillPatchIterator S_fpi(*this, D, nGrowDiff, time, State_Type, sComp, nComp);
   MultiFab& scalars = S_fpi.get_mf();

   std::unique_ptr<MultiFab> scalarsCrse;
   if (level > 0) {
     auto& crselev = getLevel(level-1);
     scalarsCrse.reset(new MultiFab(crselev.boxArray(), crselev.DistributionMap(), nComp, 1));
     FillPatch(crselev, *scalarsCrse, 1, time, State_Type, Density, nComp, 0);
   }

   //
   // Compute/adjust species fluxes/heat flux/conduction, save in class data
   FluxBoxes fb_diff;
   MultiFab **beta = fb_diff.define(this,NUM_SPECIES+1);    // Local transport coeff face-centroid container
   getDiffusivity(beta, time, first_spec, 0, NUM_SPECIES);  // species (rhoD)
   getDiffusivity(beta, time, Temp, NUM_SPECIES, 1);        // temperature (lambda)

   compute_differential_diffusion_fluxes(scalars, scalarsCrse.get(), flux, beta, dt, time, include_Wbar_terms);

   D.setVal(0.0);
   DD.setVal(0.0);

   // Compute "D":
   // D[0:NUM_SPECIES-1] = -Div( Fk )
   // D[ NUM_SPECIES+1 ] = Div( lambda Grad(T) )
   BCRec const* d_bcrec_spec = &(m_bcrec_scalars_d.dataPtr())[first_spec-Density];
   flux_divergenceRD(scalars,first_spec-Density,D,0,flux,0,NUM_SPECIES,d_bcrec_spec,-1.0,dt,1);
   BCRec const* d_bcrec_temp = &(m_bcrec_scalars_d.dataPtr())[Temp-Density];
   flux_divergenceRD(scalars,Temp-Density,D,NUM_SPECIES+1,flux,NUM_SPECIES+2,1,d_bcrec_temp,-1.0,dt);

   // Compute "DD":
   // DD = -Sum{ Div( hk . Fk ) } a.k.a. the "diffdiff" terms
   BCRec const* d_bcrec_rhoh = &(m_bcrec_scalars_d.dataPtr())[RhoH-Density];
   flux_divergenceRD(scalars,RhoH-Density,DD,0,flux,NUM_SPECIES+1,1,d_bcrec_rhoh,-1.0,dt);

   if (D.nGrow() > 0 && DD.nGrow() > 0)
   {
     const int nc = NUM_SPECIES+2;

     D.FillBoundary(0,nc, geom.periodicity());
     DD.FillBoundary(0,1, geom.periodicity());

     Extrapolater::FirstOrderExtrap(D, geom, 0, nc, D.nGrow());
     Extrapolater::FirstOrderExtrap(DD, geom, 0, 1, DD.nGrow());
   }
}